

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O1

uint16_t __thiscall snestistics::EmulateRegisters::read_word_PC(EmulateRegisters *this)

{
  uint16_t uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  
  uVar2 = this->_PC;
  bVar4 = (byte)(uVar2 >> 0x10);
  uVar3 = (uint)((ulong)uVar2 & 0xffff);
  if (((uVar3 < 0x8000) && ((uVar2 >> 0x16 & 1) == 0)) && (bVar4 = 0x7e, 0x1fff < uVar3)) {
    bVar4 = 0;
  }
  uVar5 = (ulong)bVar4 << 0x10 | (ulong)uVar2 & 0xffff;
  uVar1 = *(uint16_t *)(this->_memory + uVar5);
  if (this->_read_function != (memoryAccessFunc)0x0) {
    (*this->_read_function)
              (this->_callback_context,uVar2,(Pointer)uVar5,(uint32_t)uVar1,2,
               PROGRAM_COUNTER_RELATIVE);
  }
  this->_PC = this->_PC + 2;
  return uVar1;
}

Assistant:

uint16_t read_word_PC() {
		uint16_t v = read_word(_PC, MemoryAccessType::PROGRAM_COUNTER_RELATIVE);
		_PC += 2;
		return v;
	}